

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

uint HIST_count_simple(uint *count,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  byte *pbVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  auVar14 = in_ZMM5._0_32_;
  pbVar1 = (byte *)((long)src + srcSize);
  uVar9 = *maxSymbolValuePtr;
  memset(count,0,(ulong)(uVar9 + 1) << 2);
  if (srcSize == 0) {
    *maxSymbolValuePtr = 0;
    uVar9 = 0;
  }
  else {
    if (0 < (long)srcSize) {
      do {
        bVar2 = *src;
        if (uVar9 < bVar2) {
          __assert_fail("*ip <= maxSymbolValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1820,
                        "unsigned int HIST_count_simple(unsigned int *, unsigned int *, const void *, size_t)"
                       );
        }
        src = (void *)((long)src + 1);
        count[bVar2] = count[bVar2] + 1;
      } while (src < pbVar1);
    }
    do {
      uVar8 = uVar9;
      uVar9 = uVar8 - 1;
    } while (count[CONCAT44(0,uVar8)] == 0);
    *maxSymbolValuePtr = uVar8;
    auVar13._8_4_ = uVar8;
    auVar13._0_8_ = CONCAT44(0,uVar8);
    auVar13._12_4_ = 0;
    auVar13._16_4_ = uVar8;
    auVar13._20_4_ = 0;
    auVar13._24_4_ = uVar8;
    auVar13._28_4_ = 0;
    auVar11 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
    auVar5 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    auVar6 = vpmovsxbq_avx2(ZEXT416(0x7060504));
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar12._16_8_ = 0x8000000000000000;
    auVar12._24_8_ = 0x8000000000000000;
    auVar13 = vpor_avx2(auVar13,auVar12);
    auVar14 = vpcmpeqd_avx2(auVar14,auVar14);
    do {
      auVar15._8_8_ = uVar7;
      auVar15._0_8_ = uVar7;
      auVar15._16_8_ = uVar7;
      auVar15._24_8_ = uVar7;
      auVar16 = vpor_avx2(auVar15,auVar5);
      auVar15 = vpor_avx2(auVar15,auVar6);
      auVar15 = vpcmpgtq_avx2(auVar15 ^ auVar12,auVar13);
      auVar16 = vpcmpgtq_avx2(auVar16 ^ auVar12,auVar13);
      auVar15 = vpackssdw_avx2(auVar16,auVar15);
      auVar3 = vpackssdw_avx(SUB3216(auVar15 ^ auVar14,0),SUB3216(auVar15 ^ auVar14,0x10));
      auVar3 = vpshufd_avx(auVar3,0xd8);
      auVar16 = vpmovzxwd_avx2(auVar3);
      auVar16 = vpslld_avx2(auVar16,0x1f);
      auVar16 = vpmaskmovd_avx2(auVar16,*(undefined1 (*) [32])(count + uVar7));
      auVar10 = auVar11._0_32_;
      auVar16 = vpmaxud_avx2(auVar16,auVar10);
      auVar11 = ZEXT3264(auVar16);
      uVar7 = uVar7 + 8;
    } while (((ulong)uVar8 + 8 & 0xfffffffffffffff8) != uVar7);
    auVar14 = vpermq_avx2(auVar15,0xd8);
    auVar14 = vblendvps_avx(auVar16,auVar10,auVar14);
    auVar3 = vpmaxud_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmaxud_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmaxud_avx(auVar3,auVar4);
    uVar9 = auVar3._0_4_;
  }
  return uVar9;
}

Assistant:

unsigned HIST_count_simple(unsigned* count, unsigned* maxSymbolValuePtr,
                           const void* src, size_t srcSize)
{
    const BYTE* ip = (const BYTE*)src;
    const BYTE* const end = ip + srcSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned largestCount=0;

    memset(count, 0, (maxSymbolValue+1) * sizeof(*count));
    if (srcSize==0) { *maxSymbolValuePtr = 0; return 0; }

    while (ip<end) {
        assert(*ip <= maxSymbolValue);
        count[*ip++]++;
    }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;

    {   U32 s;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > largestCount) largestCount = count[s];
    }

    return largestCount;
}